

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

GLsizei fill_text_data(GLfloat *data,GLubyte *string,GLsizei len)

{
  GLfloat *pGVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  uint32_t uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar29;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar35;
  double dVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dStack_80;
  
  if (len < 1) {
    return 0;
  }
  dVar25 = 0.5;
  dVar30 = 0.5;
  uVar16 = 0;
  iVar14 = 0;
  do {
    bVar12 = string[uVar16];
    uVar13 = font.glyphs[bVar12].codepoint;
    switch(uVar13) {
    case 7:
    case 8:
    case 0xb:
      break;
    case 9:
      iVar15 = (int)(dVar25 * 0.015625 + 2.0);
      dVar25 = (double)((float)(int)(iVar15 - (iVar15 >> 0x1f) & 0xfffffffe) * 64.0);
      break;
    case 10:
    case 0xd:
      dVar25 = 0.0;
      break;
    case 0xc:
      dVar25 = 0.0;
      dVar30 = 0.0;
      break;
    default:
      if (uVar13 != 0x20) {
        lVar17 = (long)(iVar14 * 0x18);
        uVar2 = font.glyphs[bVar12].offset_x;
        uVar7 = font.glyphs[bVar12].offset_y;
        dVar31 = ((double)(int)uVar2 + dVar25) * 0.015625;
        dVar35 = ((double)(int)uVar7 + dVar30) * 0.015625;
        fVar18 = (float)dVar31;
        fVar21 = (float)dVar35;
        *(ulong *)(data + lVar17) = CONCAT44(fVar21,fVar18);
        uVar3 = font.glyphs[bVar12].s0;
        uVar8 = font.glyphs[bVar12].t0;
        uVar4 = font.glyphs[bVar12].s1;
        uVar9 = font.glyphs[bVar12].t1;
        dVar32 = round((double)(float)uVar3 * 640.0);
        dVar36 = round((double)(float)uVar8 * 640.0);
        auVar26._0_8_ = dVar32 + 0.5;
        auVar26._8_8_ = dVar36 + 0.5;
        dVar32 = (double)DAT_001366f0;
        dVar36 = DAT_001366f0._8_8_;
        auVar26 = divpd(auVar26,_DAT_001366f0);
        fVar19 = (float)auVar26._0_8_;
        fVar22 = (float)auVar26._8_8_;
        *(ulong *)(data + (iVar14 * 0x18 + 2)) = CONCAT44(fVar22,fVar19);
        data[iVar14 * 0x18 + 4] = fVar18;
        data[iVar14 * 0x18 + 6] = fVar19;
        dVar32 = (double)(float)uVar4 * dVar32;
        dVar36 = (double)(float)uVar9 * dVar36;
        auVar28._8_4_ = SUB84(dVar36,0);
        auVar28._0_8_ = dVar32;
        auVar28._12_4_ = (int)((ulong)dVar36 >> 0x20);
        dVar32 = round(dVar32);
        dStack_80 = auVar28._8_8_;
        dVar36 = round(dStack_80);
        auVar33._0_8_ = dVar32 + -0.5;
        auVar33._8_8_ = dVar36 + -0.5;
        uVar5 = font.glyphs[bVar12].width;
        uVar10 = font.glyphs[bVar12].height;
        auVar33 = divpd(auVar33,_DAT_001366f0);
        auVar27._0_8_ = auVar33._0_8_ - auVar26._0_8_;
        auVar27._8_8_ = auVar33._8_8_ - auVar26._8_8_;
        auVar34._0_8_ = (double)((float)uVar4 - (float)uVar3);
        auVar34._8_8_ = (double)((float)uVar9 - (float)uVar8);
        auVar28 = divpd(auVar27,auVar34);
        fVar20 = (float)(dVar31 + auVar28._0_8_ * (double)(int)uVar5 * 0.015625);
        fVar23 = (float)(dVar35 - auVar28._8_8_ * (double)(int)uVar10 * 0.015625);
        data[iVar14 * 0x18 + 5] = fVar23;
        fVar24 = (float)auVar33._0_8_;
        fVar29 = (float)auVar33._8_8_;
        *(ulong *)(data + lVar17 + 8) = CONCAT44(fVar23,fVar20);
        data[iVar14 * 0x18 + 7] = fVar29;
        pGVar1 = data + lVar17 + 10;
        *(ulong *)pGVar1 = CONCAT44(fVar29,fVar24);
        pGVar1[2] = fVar18;
        pGVar1[3] = fVar21;
        pGVar1 = data + lVar17 + 0xe;
        *pGVar1 = fVar19;
        pGVar1[1] = fVar22;
        pGVar1[2] = fVar20;
        pGVar1[3] = fVar23;
        *(ulong *)(data + lVar17 + 0x12) = CONCAT44(fVar29,fVar24);
        pGVar1 = data + lVar17 + 0x14;
        *pGVar1 = fVar20;
        pGVar1[1] = fVar21;
        pGVar1[2] = fVar24;
        pGVar1[3] = fVar22;
        iVar14 = iVar14 + 1;
      }
    }
    uVar6 = font.glyphs[bVar12].advance_x;
    uVar11 = font.glyphs[bVar12].advance_y;
    dVar25 = dVar25 + (double)(float)uVar6;
    dVar30 = dVar30 + (double)(float)uVar11;
    uVar16 = uVar16 + 1;
  } while ((uint)len != uVar16);
  return iVar14;
}

Assistant:

static GLsizei fill_text_data(GLfloat* data,
                              const GLubyte* string,
                              GLsizei len)
{
	double pen_x = 0.5; // position in pixel
	double pen_y = 0.5;
	double x,y,w,h;

	GLsizei num = 0;
	for(GLsizei i=0; i<len; i++) {
		const texture_glyph_t *glyph = font.glyphs + string[i];

		switch(glyph->codepoint) {
			// up, semi-up, semi-down...  x01 - 06, e1 - e6, c0 -df, f0 - ff  could mean something
			case '\f':  // back to the beginning
				pen_y = 0;
				/* FALLTHRU */
			case '\n':  // newline
			case '\r':  // carriage return
				pen_x = 0;
				/* FALLTHRU */
			case ' ':   // space
			case '\a':  // goes up :-)
			case '\v':  // vertical space
			case '\b':  // back the size of a space
				break;
			case '\t':  // tab
				pen_x = ((int) (pen_x/font.size + 2) / 2) * 2 * font.size;
				break;
			default:
				x = (pen_x + glyph->offset_x)/font.size;
				y = (pen_y + glyph->offset_y)/font.size;

				GLfloat s0 = glyph->s0, s1 = glyph->s1;
				GLfloat t0 = glyph->t0, t1 = glyph->t1;

				double rx = getMiddlePixelTex(&s0, &s1, font.tex_width);
				double ry = getMiddlePixelTex(&t0, &t1, font.tex_height);

				w = glyph->width*rx/font.size;
				h = glyph->height*ry/font.size;

				data[24*num + 0] = (GLfloat) x;
				data[24*num + 1] = (GLfloat) y;
				data[24*num + 2] = s0;
				data[24*num + 3] = t0;
				data[24*num + 4] = (GLfloat) x;
				data[24*num + 5] = (GLfloat) (y - h);
				data[24*num + 6] = s0;
				data[24*num + 7] = t1;
				data[24*num + 8] = (GLfloat) (x + w);
				data[24*num + 9] = (GLfloat) (y - h);
				data[24*num + 10] = s1;
				data[24*num + 11] = t1;
				data[24*num + 12] = (GLfloat) x;
				data[24*num + 13] = (GLfloat) y;
				data[24*num + 14] = s0;
				data[24*num + 15] = t0;
				data[24*num + 16] = (GLfloat) (x + w);
				data[24*num + 17] = (GLfloat) (y - h);
				data[24*num + 18] = s1;
				data[24*num + 19] = t1;
				data[24*num + 20] = (GLfloat) (x + w);
				data[24*num + 21] = (GLfloat) y;
				data[24*num + 22] = s1;
				data[24*num + 23] = t0;

				num++;
				break;

		}
		pen_x += glyph->advance_x;
		pen_y += glyph->advance_y;
	}

	return num;
}